

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

iterator __thiscall
ImplicitDepLoader::PreallocateSpace(ImplicitDepLoader *this,Edge *edge,int count)

{
  value_type local_18;
  
  local_18 = (value_type)0x0;
  std::vector<Node_*,_std::allocator<Node_*>_>::insert
            (&edge->inputs_,
             (const_iterator)
             ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)edge->order_only_deps_),(long)count,
             &local_18);
  edge->implicit_deps_ = edge->implicit_deps_ + count;
  return (iterator)
         ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish + (-(long)edge->order_only_deps_ - (long)count));
}

Assistant:

vector<Node*>::iterator ImplicitDepLoader::PreallocateSpace(Edge* edge,
                                                            int count) {
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       (size_t)count, 0);
  edge->implicit_deps_ += count;
  return edge->inputs_.end() - edge->order_only_deps_ - count;
}